

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc.cc
# Opt level: O2

void __thiscall
TCMallocImplementation::Ranges(TCMallocImplementation *this,void *arg,RangeFunction *func)

{
  bool bVar1;
  PageID start;
  long lVar2;
  MallocRange *pMVar3;
  bool bVar4;
  SpinLockHolder local_38;
  SpinLockHolder h;
  
  start = 1;
  bVar4 = false;
  do {
    if (bVar4) {
      return;
    }
    local_38.lock_ = (SpinLock *)(tcmalloc::Static::pageheap_ + 8);
    SpinLock::Lock((SpinLock *)(tcmalloc::Static::pageheap_ + 8));
    pMVar3 = (MallocRange *)
             &IterateOverRanges(void*,void(*)(void*,base::MallocRange_const*))::ranges;
    for (lVar2 = 0; bVar4 = lVar2 != 0x10, bVar4; lVar2 = lVar2 + 1) {
      bVar1 = tcmalloc::PageHeap::GetNextRange((PageHeap *)tcmalloc::Static::pageheap_,start,pMVar3)
      ;
      if (!bVar1) break;
      start = pMVar3->address + pMVar3->length + 0x1fff >> 0xd;
      pMVar3 = pMVar3 + 1;
    }
    SpinLockHolder::~SpinLockHolder(&local_38);
    pMVar3 = (MallocRange *)
             &IterateOverRanges(void*,void(*)(void*,base::MallocRange_const*))::ranges;
    while (bVar1 = lVar2 != 0, lVar2 = lVar2 + -1, bVar1) {
      (*func)(arg,pMVar3);
      pMVar3 = pMVar3 + 1;
    }
  } while( true );
}

Assistant:

virtual void Ranges(void* arg, RangeFunction func) {
    IterateOverRanges(arg, func);
  }